

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

void Nwk_ManGraphCheckLists(Nwk_Grf_t *p)

{
  int local_28;
  int local_24;
  int j;
  int i;
  Nwk_Vrt_t *pNext;
  Nwk_Vrt_t *pVertex;
  Nwk_Grf_t *p_local;
  
  if (p->pLists1[0] != 0) {
    __assert_fail("p->pLists1[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                  ,0x196,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
  }
  local_24 = 1;
  do {
    if (0x10 < local_24) {
      if (p->pLists2[0] != 0) {
        __assert_fail("p->pLists2[0] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                      ,0x1a0,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
      }
      if (p->pLists2[1] != 0) {
        __assert_fail("p->pLists2[1] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                      ,0x1a1,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
      }
      local_28 = 2;
      while( true ) {
        if (0x10 < local_28) {
          return;
        }
        if (((p->pLists2[local_28] != 0) && (p->pVerts[p->pLists2[local_28]]->nEdges != local_28))
           && (p->pVerts[p->pLists2[local_28]]->nEdges < 0x11)) break;
        local_28 = local_28 + 1;
      }
      __assert_fail("pVertex->nEdges == j || pVertex->nEdges > NWK_MAX_LIST",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                    ,0x1a6,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
    }
    if (p->pLists1[local_24] != 0) {
      if (p->pVerts[p->pLists1[local_24]]->nEdges != 1) {
        __assert_fail("pVertex->nEdges == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                      ,0x19b,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
      }
      if ((p->pVerts[p->pVerts[p->pLists1[local_24]][1].Id]->nEdges != local_24) &&
         (p->pVerts[p->pVerts[p->pLists1[local_24]][1].Id]->nEdges < 0x11)) {
        __assert_fail("pNext->nEdges == i || pNext->nEdges > NWK_MAX_LIST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkMerge.c"
                      ,0x19d,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void Nwk_ManGraphCheckLists( Nwk_Grf_t * p )
{
    Nwk_Vrt_t * pVertex, * pNext;
    int i, j;
    assert( p->pLists1[0] == 0 );
    for ( i = 1; i <= NWK_MAX_LIST; i++ )
        if ( p->pLists1[i] )
        {
            pVertex = p->pVerts[ p->pLists1[i] ];
            assert( pVertex->nEdges == 1 );
            pNext = p->pVerts[ pVertex->pEdges[0] ];
            assert( pNext->nEdges == i || pNext->nEdges > NWK_MAX_LIST );
        }
    // find the next vertext to extract
    assert( p->pLists2[0] == 0 );
    assert( p->pLists2[1] == 0 );
    for ( j = 2; j <= NWK_MAX_LIST; j++ )
        if ( p->pLists2[j] )
        {
            pVertex = p->pVerts[ p->pLists2[j] ];
            assert( pVertex->nEdges == j || pVertex->nEdges > NWK_MAX_LIST );
        }
}